

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clustergraph.cpp
# Opt level: O0

ClusterGraph * __thiscall
libDAI::ClusterGraph::VarElim
          (ClusterGraph *this,vector<libDAI::Var,_std::allocator<libDAI::Var>_> *ElimSeq)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator n_00;
  Var *in_RDI;
  const_iterator n;
  ClusterGraph Cl;
  ClusterGraph *result;
  Var *this_01;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  in_stack_fffffffffffffee8;
  Var *in_stack_fffffffffffffef0;
  ClusterGraph *in_stack_fffffffffffffef8;
  VarSet *in_stack_ffffffffffffff88;
  ClusterGraph *in_stack_ffffffffffffff90;
  
  this_01 = in_RDI;
  ClusterGraph((ClusterGraph *)in_RDI,(ClusterGraph *)in_RDI);
  ClusterGraph((ClusterGraph *)0xb2a8af);
  eraseNonMaximal((ClusterGraph *)in_stack_fffffffffffffef0);
  this_00 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin(in_RDI);
  while( true ) {
    n_00 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end(in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)this_01,
                       (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
    ::operator*((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                 *)&stack0xffffffffffffff38);
    Delta(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    insert(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    VarSet::~VarSet((VarSet *)0xb2a938);
    __gnu_cxx::
    __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
    ::operator*((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                 *)&stack0xffffffffffffff38);
    delta((ClusterGraph *)this_00._M_current,n_00._M_current);
    insert(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    VarSet::~VarSet((VarSet *)0xb2a977);
    __gnu_cxx::
    __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
    ::operator*((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                 *)&stack0xffffffffffffff38);
    eraseSubsuming((ClusterGraph *)this_01,in_RDI);
    eraseNonMaximal((ClusterGraph *)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffee8 =
         __gnu_cxx::
         __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
         ::operator++(in_stack_fffffffffffffee8._M_current,(int)((ulong)this_01 >> 0x20));
  }
  ~ClusterGraph((ClusterGraph *)0xb2aa31);
  return (ClusterGraph *)in_RDI;
}

Assistant:

ClusterGraph ClusterGraph::VarElim( const std::vector<Var> & ElimSeq ) const {
        // Make a copy
        ClusterGraph Cl(*this);

        ClusterGraph result;
        Cl.eraseNonMaximal();
        
        // Do variable elimination
        for( vector<Var>::const_iterator n = ElimSeq.begin(); n != ElimSeq.end(); n++ ) {
            assert( Cl.vars() && *n );

            result.insert( Cl.Delta(*n) );

            Cl.insert( Cl.delta(*n) );
            Cl.eraseSubsuming( *n );
            Cl.eraseNonMaximal();
        }

        return result;
    }